

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O0

void __thiscall DeckOfCards::~DeckOfCards(DeckOfCards *this)

{
  vector<Cards,_std::allocator<Cards>_> *pvVar1;
  DeckOfCards *this_local;
  
  (this->super_GamePieces)._vptr_GamePieces = (_func_int **)&PTR_shuffle_0014c970;
  pvVar1 = this->deck;
  if (pvVar1 != (vector<Cards,_std::allocator<Cards>_> *)0x0) {
    std::vector<Cards,_std::allocator<Cards>_>::~vector(pvVar1);
    operator_delete(pvVar1,0x18);
  }
  pvVar1 = this->discardedDeck;
  if (pvVar1 != (vector<Cards,_std::allocator<Cards>_> *)0x0) {
    std::vector<Cards,_std::allocator<Cards>_>::~vector(pvVar1);
    operator_delete(pvVar1,0x18);
  }
  pvVar1 = this->specialDeck;
  if (pvVar1 != (vector<Cards,_std::allocator<Cards>_> *)0x0) {
    std::vector<Cards,_std::allocator<Cards>_>::~vector(pvVar1);
    operator_delete(pvVar1,0x18);
  }
  this->deck = (vector<Cards,_std::allocator<Cards>_> *)0x0;
  this->discardedDeck = (vector<Cards,_std::allocator<Cards>_> *)0x0;
  this->specialDeck = (vector<Cards,_std::allocator<Cards>_> *)0x0;
  return;
}

Assistant:

DeckOfCards::~DeckOfCards() {
    delete deck;
    delete discardedDeck;
    delete specialDeck;
    deck=NULL;
    discardedDeck=NULL;
    specialDeck=NULL;
}